

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

char * glfwGetKeyName(int key,int scancode)

{
  char *pcVar1;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return (char *)0x0;
  }
  if (key != -1) {
    if ((key != 0x150) && (key - 0x14fU < 0xfffffff1 && key - 0xa3U < 0xffffff84)) {
      return (char *)0x0;
    }
    scancode = _glfwPlatformGetKeyScancode(key);
  }
  pcVar1 = _glfwPlatformGetScancodeName(scancode);
  return pcVar1;
}

Assistant:

GLFWAPI const char* glfwGetKeyName(int key, int scancode)
{
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (key != GLFW_KEY_UNKNOWN)
    {
        if (key != GLFW_KEY_KP_EQUAL &&
            (key < GLFW_KEY_KP_0 || key > GLFW_KEY_KP_ADD) &&
            (key < GLFW_KEY_APOSTROPHE || key > GLFW_KEY_WORLD_2))
        {
            return NULL;
        }

        scancode = _glfwPlatformGetKeyScancode(key);
    }

    return _glfwPlatformGetScancodeName(scancode);
}